

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_cas2w(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  uint16_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  TCGv_i32 arg2;
  TCGv_i32 regs;
  TCGv_i32 addr2;
  TCGv_i32 addr1;
  uint16_t ext2;
  uint16_t ext1;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = read_im16(env,s);
  if ((uVar1 & 0x8000) == 0) {
    addr2 = tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar1 >> 0xc & 7)];
  }
  else {
    addr2 = get_areg(s,(int)(uint)uVar1 >> 0xc & 7);
  }
  uVar2 = read_im16(env,s);
  if ((uVar2 & 0x8000) == 0) {
    regs = tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar2 >> 0xc & 7)];
  }
  else {
    regs = get_areg(s,(int)(uint)uVar2 >> 0xc & 7);
  }
  arg2 = tcg_const_i32_m68k(tcg_ctx_00,
                            (int)(uint)uVar2 >> 6 & 7U | ((int)(uint)uVar1 >> 6 & 7U) << 3 |
                            (uVar2 & 7) << 6 | (uVar1 & 7) << 9);
  uVar3 = tb_cflags((TranslationBlock *)(s->base).tb);
  if ((uVar3 & 0x80000) == 0) {
    gen_helper_cas2w(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,addr2,regs);
  }
  else {
    gen_helper_exit_atomic(tcg_ctx_00,tcg_ctx_00->cpu_env);
  }
  tcg_temp_free_i32(tcg_ctx_00,arg2);
  s->cc_op = CC_OP_CMPW;
  s->cc_op_synced = 1;
  return;
}

Assistant:

DISAS_INSN(cas2w)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint16_t ext1, ext2;
    TCGv addr1, addr2;
    TCGv regs;

    /* cas2 Dc1:Dc2,Du1:Du2,(Rn1):(Rn2) */

    ext1 = read_im16(env, s);

    if (ext1 & 0x8000) {
        /* Address Register */
        addr1 = AREG(ext1, 12);
    } else {
        /* Data Register */
        addr1 = DREG(ext1, 12);
    }

    ext2 = read_im16(env, s);
    if (ext2 & 0x8000) {
        /* Address Register */
        addr2 = AREG(ext2, 12);
    } else {
        /* Data Register */
        addr2 = DREG(ext2, 12);
    }

    /*
     * if (R1) == Dc1 && (R2) == Dc2 then
     *     (R1) = Du1
     *     (R2) = Du2
     * else
     *     Dc1 = (R1)
     *     Dc2 = (R2)
     */

    regs = tcg_const_i32(tcg_ctx, REG(ext2, 6) |
                         (REG(ext1, 6) << 3) |
                         (REG(ext2, 0) << 6) |
                         (REG(ext1, 0) << 9));
    if (tb_cflags(s->base.tb) & CF_PARALLEL) {
        gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
    } else {
        gen_helper_cas2w(tcg_ctx, tcg_ctx->cpu_env, regs, addr1, addr2);
    }
    tcg_temp_free(tcg_ctx, regs);

    /* Note that cas2w also assigned to env->cc_op.  */
    s->cc_op = CC_OP_CMPW;
    s->cc_op_synced = 1;
}